

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordEmbedding.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CoreMLModels::WordEmbedding::WordEmbedding
          (WordEmbedding *this,WordEmbedding *from)

{
  void *pvVar1;
  ArenaStringPtr AVar2;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__WordEmbedding_0039e7c0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->language_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  AVar2.ptr_ = (from->language_).ptr_;
  if ((AVar2.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->language_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar2);
  }
  (this->modelparameterdata_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  AVar2.ptr_ = (from->modelparameterdata_).ptr_;
  if ((AVar2.ptr_)->_M_string_length != 0) {
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->modelparameterdata_,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,AVar2);
  }
  this->revision_ = from->revision_;
  return;
}

Assistant:

WordEmbedding::WordEmbedding(const WordEmbedding& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  language_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.language().size() > 0) {
    language_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.language_);
  }
  modelparameterdata_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.modelparameterdata().size() > 0) {
    modelparameterdata_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.modelparameterdata_);
  }
  revision_ = from.revision_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CoreMLModels.WordEmbedding)
}